

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

bool ON_SHA1::Validate(void)

{
  bool bVar1;
  int iVar2;
  ON__UINT32 OVar3;
  size_t i;
  long lVar4;
  ulong uVar5;
  ON__UINT64 sizeof_buffer;
  ulong uVar6;
  ON_SHA1 local_b78;
  ON_SHA1_Hash sha1_digestx;
  ON_SHA1_Hash sha1_digest;
  ON__UINT8 a [200];
  ON_RandomNumberGenerator rng;
  
  bVar1 = SHA1_ValidateHelper("",&DAT_006c5280);
  if ((((bVar1) && (iVar2 = bcmp(&ON_SHA1_Hash::EmptyContentHash,&DAT_006c5280,0x14), iVar2 == 0))
      && (bVar1 = SHA1_ValidateHelper("abc",&DAT_006c52a0), bVar1)) &&
     (((bVar1 = SHA1_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
                                    &DAT_006c52c0), bVar1 &&
       (bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog",&DAT_006c52e0),
       bVar1)) &&
      ((bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy cog",&DAT_006c5300),
       bVar1 && (bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog.",
                                             &DAT_006c5320), bVar1)))))) {
    for (lVar4 = 0; lVar4 != 200; lVar4 = lVar4 + 1) {
      a[lVar4] = 'a';
    }
    local_b78.m_state[2] = 0;
    local_b78.m_state[3] = 0;
    local_b78.m_state[4] = 0;
    local_b78.m_bit_count[0] = 0;
    local_b78.m_bit_count[1] = 0;
    local_b78.m_state[0] = 0;
    local_b78.m_state[1] = 0;
    local_b78.m_buffer[0x30] = '\0';
    local_b78.m_buffer[0x31] = '\0';
    local_b78.m_buffer[0x32] = '\0';
    local_b78.m_buffer[0x33] = '\0';
    local_b78.m_buffer[0x34] = '\0';
    local_b78.m_buffer[0x35] = '\0';
    local_b78.m_buffer[0x36] = '\0';
    local_b78.m_buffer[0x37] = '\0';
    local_b78.m_buffer[0x38] = '\0';
    local_b78.m_buffer[0x39] = '\0';
    local_b78.m_buffer[0x3a] = '\0';
    local_b78.m_buffer[0x3b] = '\0';
    local_b78.m_buffer[0x3c] = '\0';
    local_b78.m_buffer[0x3d] = '\0';
    local_b78.m_buffer[0x3e] = '\0';
    local_b78.m_buffer[0x3f] = '\0';
    local_b78.m_buffer[0x20] = '\0';
    local_b78.m_buffer[0x21] = '\0';
    local_b78.m_buffer[0x22] = '\0';
    local_b78.m_buffer[0x23] = '\0';
    local_b78.m_buffer[0x24] = '\0';
    local_b78.m_buffer[0x25] = '\0';
    local_b78.m_buffer[0x26] = '\0';
    local_b78.m_buffer[0x27] = '\0';
    local_b78.m_buffer[0x28] = '\0';
    local_b78.m_buffer[0x29] = '\0';
    local_b78.m_buffer[0x2a] = '\0';
    local_b78.m_buffer[0x2b] = '\0';
    local_b78.m_buffer[0x2c] = '\0';
    local_b78.m_buffer[0x2d] = '\0';
    local_b78.m_buffer[0x2e] = '\0';
    local_b78.m_buffer[0x2f] = '\0';
    local_b78.m_buffer[0x10] = '\0';
    local_b78.m_buffer[0x11] = '\0';
    local_b78.m_buffer[0x12] = '\0';
    local_b78.m_buffer[0x13] = '\0';
    local_b78.m_buffer[0x14] = '\0';
    local_b78.m_buffer[0x15] = '\0';
    local_b78.m_buffer[0x16] = '\0';
    local_b78.m_buffer[0x17] = '\0';
    local_b78.m_buffer[0x18] = '\0';
    local_b78.m_buffer[0x19] = '\0';
    local_b78.m_buffer[0x1a] = '\0';
    local_b78.m_buffer[0x1b] = '\0';
    local_b78.m_buffer[0x1c] = '\0';
    local_b78.m_buffer[0x1d] = '\0';
    local_b78.m_buffer[0x1e] = '\0';
    local_b78.m_buffer[0x1f] = '\0';
    local_b78.m_buffer[0] = '\0';
    local_b78.m_buffer[1] = '\0';
    local_b78.m_buffer[2] = '\0';
    local_b78.m_buffer[3] = '\0';
    local_b78.m_buffer[4] = '\0';
    local_b78.m_buffer[5] = '\0';
    local_b78.m_buffer[6] = '\0';
    local_b78.m_buffer[7] = '\0';
    local_b78.m_buffer[8] = '\0';
    local_b78.m_buffer[9] = '\0';
    local_b78.m_buffer[10] = '\0';
    local_b78.m_buffer[0xb] = '\0';
    local_b78.m_buffer[0xc] = '\0';
    local_b78.m_buffer[0xd] = '\0';
    local_b78.m_buffer[0xe] = '\0';
    local_b78.m_buffer[0xf] = '\0';
    local_b78.m_byte_count = 0;
    local_b78.m_status_bits = 0;
    local_b78.m_reserved = 0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_b78.m_sha1_hash);
    uVar5 = 0;
    do {
      if (999999 < uVar5) {
        Hash(&sha1_digest,&local_b78);
        iVar2 = bcmp(&sha1_digest,&DAT_006c5340,0x14);
        if (iVar2 != 0) {
          return false;
        }
        local_b78.m_byte_count = 0;
        local_b78.m_bit_count[0] = 0;
        local_b78.m_bit_count[1] = 0;
        local_b78.m_state[0] = 0x67452301;
        local_b78.m_state[1] = 0xefcdab89;
        local_b78.m_state[2] = 0x98badcfe;
        local_b78.m_state[3] = 0x10325476;
        local_b78.m_state[4] = 0xc3d2e1f0;
        local_b78.m_status_bits = 1;
        ON_RandomNumberGenerator::ON_RandomNumberGenerator(&rng);
        uVar5 = 0;
        do {
          if (999999 < uVar5) {
            Hash(&sha1_digestx,&local_b78);
            iVar2 = bcmp(&sha1_digestx,&DAT_006c5340,0x14);
            return iVar2 == 0;
          }
          OVar3 = ON_RandomNumberGenerator::RandomNumber(&rng);
          sizeof_buffer = 1000000 - uVar5;
          if ((ulong)OVar3 % 100 + uVar5 + 100 < 0xf4241) {
            sizeof_buffer = (ulong)OVar3 % 100 + 100;
          }
          AccumulateBytes(&local_b78,a,sizeof_buffer);
          uVar5 = uVar5 + sizeof_buffer;
        } while (local_b78.m_byte_count == uVar5);
        return false;
      }
      AccumulateBytes(&local_b78,a,200);
      uVar6 = uVar5 + 200;
      uVar5 = local_b78.m_byte_count;
    } while (local_b78.m_byte_count == uVar6);
  }
  return false;
}

Assistant:

bool ON_SHA1::Validate()
{
  // "" (empty string)
  // da39a3ee 5e6b4b0d 3255bfef 95601890 afd80709
  const ON__UINT8 empty_string[20] = {
    0xda, 0x39, 0xa3, 0xee,
    0x5e, 0x6b, 0x4b, 0x0d,
    0x32, 0x55, 0xbf, 0xef,
    0x95, 0x60, 0x18, 0x90,
    0xaf, 0xd8, 0x07, 0x09 
  };
  if (false == SHA1_ValidateHelper("",empty_string))
    return false;

  
  if (0 != memcmp(&ON_SHA1_Hash::EmptyContentHash ,empty_string, sizeof(empty_string)))
    return false;

  // "abc"
  // a9993e36 4706816a ba3e2571 7850c26c 9cd0d89d
  const ON__UINT8 abc[20]  = { 
    0xa9, 0x99, 0x3e, 0x36,
    0x47, 0x06, 0x81, 0x6a,
    0xba, 0x3e, 0x25, 0x71,
    0x78, 0x50, 0xc2, 0x6c,
    0x9c, 0xd0, 0xd8, 0x9d  
  };
  if (false == SHA1_ValidateHelper("abc",abc))
    return false;

  // "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq"
  // 84983e44 1c3bd26e baae4aa1 f95129e5 e54670f1
  const ON__UINT8 abc_x[20] = { 
    0x84, 0x98, 0x3e, 0x44,
    0x1c, 0x3b, 0xd2, 0x6e,
    0xba, 0xae, 0x4a, 0xa1,
    0xf9, 0x51, 0x29, 0xe5,
    0xe5, 0x46, 0x70, 0xf1 
  };
  if (false == SHA1_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",abc_x))
    return false;

  // "The quick brown fox jumps over the lazy dog"
  // 2fd4e1c6 7a2d28fc ed849ee1 bb76e739 1b93eb12
  const ON__UINT8 quickfox[20] = {
    0x2f, 0xd4, 0xe1, 0xc6,
    0x7a, 0x2d, 0x28, 0xfc,
    0xed, 0x84, 0x9e, 0xe1,
    0xbb, 0x76, 0xe7, 0x39,
    0x1b, 0x93, 0xeb, 0x12 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog",quickfox))
    return false;

  // "The quick brown fox jumps over the lazy cog"
  // de9f2c7f d25e1b3a fad3e85a 0bd17d9b 100db4b3
  const ON__UINT8 lazycog[20] = {
    0xde, 0x9f, 0x2c, 0x7f,
    0xd2, 0x5e, 0x1b, 0x3a,
    0xfa, 0xd3, 0xe8, 0x5a,
    0x0b, 0xd1, 0x7d, 0x9b,
    0x10, 0x0d, 0xb4, 0xb3 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy cog",lazycog))
    return false;

  // "The quick brown fox jumps over the lazy dog."
  // 408d9438 4216f890 ff7a0c35 28e8bed1 e0b01621
  const ON__UINT8 quickfoxperiod[20] = {
    0x40, 0x8d, 0x94, 0x38,
    0x42, 0x16, 0xf8, 0x90,
    0xff, 0x7a, 0x0c, 0x35,
    0x28, 0xe8, 0xbe, 0xd1,
    0xe0, 0xb0, 0x16, 0x21 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog.",quickfoxperiod))
    return false;

  // 1,000,000 repetitions of the character "a".
  // 34AA973C D4C4DAA4 F61EEB2B DBAD2731 6534016F
  const ON__UINT8 millionXa[20] = {
    0x34, 0xAA, 0x97, 0x3C,
    0xD4, 0xC4, 0xDA, 0xA4,
    0xF6, 0x1E, 0xEB, 0x2B,
    0xDB, 0xAD, 0x27, 0x31,
    0x65, 0x34, 0x01, 0x6F 
  };

  const size_t one_million = 1000000;
  ON__UINT8 a[200];
  const size_t a_count = sizeof(a) / sizeof(a[0]);
  for ( size_t i = 0; i < a_count; i++)
    a[i] = 'a';  
  ON_SHA1 sha1;
  size_t total_count = 0;
  for (total_count = 0; total_count < one_million; total_count += a_count)
  {
    sha1.AccumulateBytes(a, a_count);
    if (sha1.ByteCount() != (ON__UINT64)(total_count+a_count))
      return false;
  }
  
  ON_SHA1_Hash sha1_digest(sha1.Hash());

  if (0 != memcmp(&sha1_digest,millionXa,sizeof(millionXa)))
    return false;

  sha1.Reset();
  ON_RandomNumberGenerator rng;
  total_count = 0; 
  const size_t min_count = (a_count >= 10000) ? a_count/1000 : 100;
  while (total_count < one_million)
  {
    size_t count = min_count + (rng.RandomNumber() % (ON__UINT32)min_count);
    if ( total_count + count > one_million )
      count = one_million - total_count;
    sha1.AccumulateBytes(a, count);
    total_count += count;
    if (sha1.ByteCount() != (ON__UINT64)total_count)
      return false;
  }

  
  ON_SHA1_Hash sha1_digestx(sha1.Hash());

  if (0 != memcmp(&sha1_digestx,millionXa,sizeof(millionXa)))
    return false;

  return true;
}